

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertions.h
# Opt level: O1

_Deque_iterator<long,_long_&,_long_*> * __thiscall
UnitTests::OutputElement<std::_Deque_iterator<long,long&,long*>>
          (_Deque_iterator<long,_long_&,_long_*> *__return_storage_ptr__,UnitTests *this,ostream *os
          ,_Deque_iterator<long,_long_&,_long_*> *iter,_Deque_iterator<long,_long_&,_long_*> *end)

{
  long lVar1;
  
  if (*(_Elt_pointer *)os == iter->_M_cur) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"##EOF!##",8);
  }
  else {
    std::ostream::_M_insert<long>((long)this);
    lVar1 = *(long *)os;
    *(long *)os = lVar1 + 8;
    if (lVar1 + 8 == *(long *)(os + 0x10)) {
      lVar1 = *(long *)(os + 0x18);
      *(long *)(os + 0x18) = lVar1 + 8;
      lVar1 = *(long *)(lVar1 + 8);
      *(long *)(os + 8) = lVar1;
      *(long *)(os + 0x10) = lVar1 + 0x200;
      *(long *)os = lVar1;
    }
  }
  __return_storage_ptr__->_M_cur = *(_Elt_pointer *)os;
  __return_storage_ptr__->_M_first = *(_Elt_pointer *)(os + 8);
  __return_storage_ptr__->_M_last = *(_Elt_pointer *)(os + 0x10);
  __return_storage_ptr__->_M_node = *(_Map_pointer *)(os + 0x18);
  return __return_storage_ptr__;
}

Assistant:

It OutputElement(std::ostream& os, It iter, It end)
    {
        if (iter != end)
        {
            os << stream(*iter);
            return ++iter;
        }
        os << "##EOF!##";
        return iter;
    }